

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::
InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
::reserve(InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
          *this,size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *ppVar4;
  long lVar5;
  int i;
  ulong uVar6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *ppVar7;
  
  if (this->ptr ==
      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
       *)0x0) {
    uVar6 = 0x10;
  }
  else {
    uVar6 = this->nAlloc;
  }
  if (uVar6 < n) {
    ppVar4 = pstd::pmr::
             polymorphic_allocator<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>
             ::allocate_object<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>
                       ((polymorphic_allocator<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>
                         *)this,n);
    lVar5 = 0;
    for (uVar6 = 0; uVar6 < this->nStored; uVar6 = uVar6 + 1) {
      ppVar7 = this->ptr;
      if (this->ptr ==
          (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
           *)0x0) {
        ppVar7 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)&this->field_2;
      }
      puVar1 = (undefined8 *)((long)&ppVar7->first + lVar5);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&ppVar4->first + lVar5);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      lVar5 = lVar5 + 0x10;
    }
    pstd::pmr::
    polymorphic_allocator<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>::
    deallocate_object<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>
              ((polymorphic_allocator<std::pair<std::__cxx11::string_const*,std::__cxx11::string_const*>>
                *)this,this->ptr,this->nAlloc);
    this->nAlloc = n;
    this->ptr = ppVar4;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }